

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O2

SampledSpectrum pbrt::FrConductor(Float cosTheta_i,SampledSpectrum *eta,SampledSpectrum *k)

{
  undefined1 auVar1 [16];
  float c;
  float c_00;
  undefined8 uVar2;
  bool bVar3;
  undefined1 in_register_00001204 [60];
  undefined1 auVar4 [64];
  undefined1 auVar30 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar56 [56];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  SampledSpectrum SVar57;
  SampledSpectrum t4;
  SampledSpectrum Rs;
  SampledSpectrum t2;
  SampledSpectrum a;
  SampledSpectrum t1;
  SampledSpectrum Rp;
  SampledSpectrum t3;
  SampledSpectrum a2plusb2;
  SampledSpectrum etak;
  SampledSpectrum t0;
  SampledSpectrum etak2;
  SampledSpectrum eta2;
  SampledSpectrum local_138;
  SampledSpectrum local_128;
  SampledSpectrum local_118;
  SampledSpectrum local_108;
  SampledSpectrum local_f8;
  undefined1 local_e8 [16];
  SampledSpectrum local_d8;
  SampledSpectrum local_c8;
  SampledSpectrum local_b8;
  SampledSpectrum local_a8;
  SampledSpectrum local_98;
  SampledSpectrum local_80;
  SampledSpectrum local_70;
  SampledSpectrum local_60;
  SampledSpectrum local_50;
  SampledSpectrum local_40;
  
  auVar4._4_60_ = in_register_00001204;
  auVar4._0_4_ = cosTheta_i;
  auVar56 = (undefined1  [56])0x0;
  auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar4._0_16_);
  uVar2 = vcmpss_avx512f(auVar4._0_16_,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar3 = (bool)((byte)uVar2 & 1);
  local_e8._4_12_ = auVar1._4_12_;
  local_e8._0_4_ = (uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar1._0_4_;
  local_98.values.values._0_8_ = *(undefined8 *)(k->values).values;
  local_98.values.values._8_8_ = *(undefined8 *)((k->values).values + 2);
  c = (float)local_e8._0_4_ * (float)local_e8._0_4_;
  c_00 = 1.0 - c;
  auVar30 = (undefined1  [56])0x0;
  SVar57 = SampledSpectrum::operator*(eta,eta);
  auVar31._0_8_ = SVar57.values.values._8_8_;
  auVar31._8_56_ = auVar56;
  auVar5._0_8_ = SVar57.values.values._0_8_;
  auVar5._8_56_ = auVar30;
  local_40.values.values = (array<float,_4>)vmovlhps_avx(auVar5._0_16_,auVar31._0_16_);
  auVar30 = ZEXT856(local_40.values.values._8_8_);
  SVar57 = SampledSpectrum::operator*(&local_98,&local_98);
  auVar32._0_8_ = SVar57.values.values._8_8_;
  auVar32._8_56_ = auVar56;
  auVar6._0_8_ = SVar57.values.values._0_8_;
  auVar6._8_56_ = auVar30;
  local_50.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar32._0_16_);
  auVar30 = ZEXT856(local_50.values.values._8_8_);
  SVar57 = SampledSpectrum::operator-(&local_40,&local_50);
  auVar33._0_8_ = SVar57.values.values._8_8_;
  auVar33._8_56_ = auVar56;
  auVar7._0_8_ = SVar57.values.values._0_8_;
  auVar7._8_56_ = auVar30;
  local_a8.values.values = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar33._0_16_);
  auVar30 = (undefined1  [56])0x0;
  SampledSpectrum::SampledSpectrum(&local_f8,c_00);
  SVar57 = SampledSpectrum::operator-(&local_a8,&local_f8);
  auVar34._0_8_ = SVar57.values.values._8_8_;
  auVar34._8_56_ = auVar56;
  auVar8._0_8_ = SVar57.values.values._0_8_;
  auVar8._8_56_ = auVar30;
  local_60.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar34._0_16_);
  auVar30 = ZEXT856(local_60.values.values._8_8_);
  SVar57 = SampledSpectrum::operator*(&local_60,&local_60);
  auVar35._0_8_ = SVar57.values.values._8_8_;
  auVar35._8_56_ = auVar56;
  auVar9._0_8_ = SVar57.values.values._0_8_;
  auVar9._8_56_ = auVar30;
  local_108.values.values = (array<float,_4>)vmovlhps_avx(auVar9._0_16_,auVar35._0_16_);
  auVar30 = (undefined1  [56])0x0;
  SVar57 = SampledSpectrum::operator*(&local_40,4.0);
  auVar36._0_8_ = SVar57.values.values._8_8_;
  auVar36._8_56_ = auVar56;
  auVar10._0_8_ = SVar57.values.values._0_8_;
  auVar10._8_56_ = auVar30;
  local_128.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar36._0_16_);
  auVar30 = ZEXT856(local_128.values.values._8_8_);
  SVar57 = SampledSpectrum::operator*(&local_128,&local_50);
  auVar37._0_8_ = SVar57.values.values._8_8_;
  auVar37._8_56_ = auVar56;
  auVar11._0_8_ = SVar57.values.values._0_8_;
  auVar11._8_56_ = auVar30;
  local_118.values.values = (array<float,_4>)vmovlhps_avx(auVar11._0_16_,auVar37._0_16_);
  auVar30 = ZEXT856(local_118.values.values._8_8_);
  SVar57 = SampledSpectrum::operator+(&local_108,&local_118);
  auVar38._0_8_ = SVar57.values.values._8_8_;
  auVar38._8_56_ = auVar56;
  auVar12._0_8_ = SVar57.values.values._0_8_;
  auVar12._8_56_ = auVar30;
  local_f8.values.values = (array<float,_4>)vmovlhps_avx(auVar12._0_16_,auVar38._0_16_);
  auVar30 = ZEXT856(local_f8.values.values._8_8_);
  SVar57 = Sqrt(&local_f8);
  auVar39._0_8_ = SVar57.values.values._8_8_;
  auVar39._8_56_ = auVar56;
  auVar13._0_8_ = SVar57.values.values._0_8_;
  auVar13._8_56_ = auVar30;
  local_a8.values.values = (array<float,_4>)vmovlhps_avx(auVar13._0_16_,auVar39._0_16_);
  auVar30 = (undefined1  [56])0x0;
  SampledSpectrum::SampledSpectrum(&local_108,c);
  SVar57 = SampledSpectrum::operator+(&local_a8,&local_108);
  auVar40._0_8_ = SVar57.values.values._8_8_;
  auVar40._8_56_ = auVar56;
  auVar14._0_8_ = SVar57.values.values._0_8_;
  auVar14._8_56_ = auVar30;
  local_f8.values.values = (array<float,_4>)vmovlhps_avx(auVar14._0_16_,auVar40._0_16_);
  auVar30 = ZEXT856(local_f8.values.values._8_8_);
  SVar57 = SampledSpectrum::operator+(&local_a8,&local_60);
  auVar41._0_8_ = SVar57.values.values._8_8_;
  auVar41._8_56_ = auVar56;
  auVar15._0_8_ = SVar57.values.values._0_8_;
  auVar15._8_56_ = auVar30;
  local_128.values.values = (array<float,_4>)vmovlhps_avx(auVar15._0_16_,auVar41._0_16_);
  auVar30 = (undefined1  [56])0x0;
  SVar57 = SampledSpectrum::operator*(&local_128,0.5);
  auVar42._0_8_ = SVar57.values.values._8_8_;
  auVar42._8_56_ = auVar56;
  auVar16._0_8_ = SVar57.values.values._0_8_;
  auVar16._8_56_ = auVar30;
  local_118.values.values = (array<float,_4>)vmovlhps_avx(auVar16._0_16_,auVar42._0_16_);
  auVar30 = ZEXT856(local_118.values.values._8_8_);
  SVar57 = SafeSqrt(&local_118);
  auVar43._0_8_ = SVar57.values.values._8_8_;
  auVar43._8_56_ = auVar56;
  auVar17._0_8_ = SVar57.values.values._0_8_;
  auVar17._8_56_ = auVar30;
  local_108.values.values = (array<float,_4>)vmovlhps_avx(auVar17._0_16_,auVar43._0_16_);
  auVar30 = (undefined1  [56])0x0;
  SVar57 = SampledSpectrum::operator*(&local_108,(float)local_e8._0_4_ + (float)local_e8._0_4_);
  auVar44._0_8_ = SVar57.values.values._8_8_;
  auVar44._8_56_ = auVar56;
  auVar18._0_8_ = SVar57.values.values._0_8_;
  auVar18._8_56_ = auVar30;
  local_118.values.values = (array<float,_4>)vmovlhps_avx(auVar18._0_16_,auVar44._0_16_);
  auVar30 = ZEXT856(local_118.values.values._8_8_);
  SVar57 = SampledSpectrum::operator-(&local_f8,&local_118);
  auVar45._0_8_ = SVar57.values.values._8_8_;
  auVar45._8_56_ = auVar56;
  auVar19._0_8_ = SVar57.values.values._0_8_;
  auVar19._8_56_ = auVar30;
  local_b8.values.values = (array<float,_4>)vmovlhps_avx(auVar19._0_16_,auVar45._0_16_);
  auVar30 = ZEXT856(local_b8.values.values._8_8_);
  SVar57 = SampledSpectrum::operator+(&local_f8,&local_118);
  auVar46._0_8_ = SVar57.values.values._8_8_;
  auVar46._8_56_ = auVar56;
  auVar20._0_8_ = SVar57.values.values._0_8_;
  auVar20._8_56_ = auVar30;
  local_138.values.values = (array<float,_4>)vmovlhps_avx(auVar20._0_16_,auVar46._0_16_);
  auVar30 = ZEXT856(local_138.values.values._8_8_);
  SVar57 = SampledSpectrum::operator/(&local_b8,&local_138);
  auVar47._0_8_ = SVar57.values.values._8_8_;
  auVar47._8_56_ = auVar56;
  auVar21._0_8_ = SVar57.values.values._0_8_;
  auVar21._8_56_ = auVar30;
  local_128.values.values = (array<float,_4>)vmovlhps_avx(auVar21._0_16_,auVar47._0_16_);
  auVar30 = (undefined1  [56])0x0;
  SVar57 = SampledSpectrum::operator*(&local_a8,c);
  auVar48._0_8_ = SVar57.values.values._8_8_;
  auVar48._8_56_ = auVar56;
  auVar22._0_8_ = SVar57.values.values._0_8_;
  auVar22._8_56_ = auVar30;
  local_138.values.values = (array<float,_4>)vmovlhps_avx(auVar22._0_16_,auVar48._0_16_);
  auVar30 = (undefined1  [56])0x0;
  SampledSpectrum::SampledSpectrum(&local_c8,c_00 * c_00);
  SVar57 = SampledSpectrum::operator+(&local_138,&local_c8);
  auVar49._0_8_ = SVar57.values.values._8_8_;
  auVar49._8_56_ = auVar56;
  auVar23._0_8_ = SVar57.values.values._0_8_;
  auVar23._8_56_ = auVar30;
  local_b8.values.values = (array<float,_4>)vmovlhps_avx(auVar23._0_16_,auVar49._0_16_);
  auVar30 = (undefined1  [56])0x0;
  SVar57 = SampledSpectrum::operator*(&local_118,c_00);
  auVar50._0_8_ = SVar57.values.values._8_8_;
  auVar50._8_56_ = auVar56;
  auVar24._0_8_ = SVar57.values.values._0_8_;
  auVar24._8_56_ = auVar30;
  local_138.values.values = (array<float,_4>)vmovlhps_avx(auVar24._0_16_,auVar50._0_16_);
  auVar30 = ZEXT856(local_138.values.values._8_8_);
  SVar57 = SampledSpectrum::operator-(&local_b8,&local_138);
  auVar51._0_8_ = SVar57.values.values._8_8_;
  auVar51._8_56_ = auVar56;
  auVar25._0_8_ = SVar57.values.values._0_8_;
  auVar25._8_56_ = auVar30;
  local_70.values.values = (array<float,_4>)vmovlhps_avx(auVar25._0_16_,auVar51._0_16_);
  auVar30 = ZEXT856(local_70.values.values._8_8_);
  SVar57 = SampledSpectrum::operator*(&local_128,&local_70);
  auVar52._0_8_ = SVar57.values.values._8_8_;
  auVar52._8_56_ = auVar56;
  auVar26._0_8_ = SVar57.values.values._0_8_;
  auVar26._8_56_ = auVar30;
  local_d8.values.values = (array<float,_4>)vmovlhps_avx(auVar26._0_16_,auVar52._0_16_);
  auVar30 = ZEXT856(local_d8.values.values._8_8_);
  SVar57 = SampledSpectrum::operator+(&local_b8,&local_138);
  auVar53._0_8_ = SVar57.values.values._8_8_;
  auVar53._8_56_ = auVar56;
  auVar27._0_8_ = SVar57.values.values._0_8_;
  auVar27._8_56_ = auVar30;
  local_80.values.values = (array<float,_4>)vmovlhps_avx(auVar27._0_16_,auVar53._0_16_);
  auVar30 = ZEXT856(local_80.values.values._8_8_);
  SVar57 = SampledSpectrum::operator/(&local_d8,&local_80);
  auVar54._0_8_ = SVar57.values.values._8_8_;
  auVar54._8_56_ = auVar56;
  auVar28._0_8_ = SVar57.values.values._0_8_;
  auVar28._8_56_ = auVar30;
  local_c8.values.values = (array<float,_4>)vmovlhps_avx(auVar28._0_16_,auVar54._0_16_);
  auVar30 = ZEXT856(local_c8.values.values._8_8_);
  SVar57 = SampledSpectrum::operator+(&local_c8,&local_128);
  auVar55._0_8_ = SVar57.values.values._8_8_;
  auVar55._8_56_ = auVar56;
  auVar29._0_8_ = SVar57.values.values._0_8_;
  auVar29._8_56_ = auVar30;
  local_d8.values.values = (array<float,_4>)vmovlhps_avx(auVar29._0_16_,auVar55._0_16_);
  SVar57 = SampledSpectrum::operator*(&local_d8,0.5);
  return (array<float,_4>)(array<float,_4>)SVar57;
}

Assistant:

PBRT_CPU_GPU
inline SampledSpectrum FrConductor(Float cosTheta_i, const SampledSpectrum &eta,
                                   const SampledSpectrum &k) {
    cosTheta_i = Clamp(cosTheta_i, -1, 1);
    SampledSpectrum etak = k;

    Float cos2Theta_i = cosTheta_i * cosTheta_i;
    Float sin2Theta_i = 1 - cos2Theta_i;
    SampledSpectrum eta2 = eta * eta;
    SampledSpectrum etak2 = etak * etak;

    SampledSpectrum t0 = eta2 - etak2 - SampledSpectrum(sin2Theta_i);
    SampledSpectrum a2plusb2 = Sqrt(t0 * t0 + 4 * eta2 * etak2);
    SampledSpectrum t1 = a2plusb2 + SampledSpectrum(cos2Theta_i);
    SampledSpectrum a = SafeSqrt(0.5f * (a2plusb2 + t0));
    SampledSpectrum t2 = (Float)2 * cosTheta_i * a;
    SampledSpectrum Rs = (t1 - t2) / (t1 + t2);

    SampledSpectrum t3 =
        cos2Theta_i * a2plusb2 + SampledSpectrum(sin2Theta_i * sin2Theta_i);
    SampledSpectrum t4 = t2 * sin2Theta_i;
    SampledSpectrum Rp = Rs * (t3 - t4) / (t3 + t4);

    return 0.5f * (Rp + Rs);
}